

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobject.cpp
# Opt level: O1

PAL_ERROR __thiscall
CorUnix::CSharedMemoryWaitableObject::EnsureObjectIsShared
          (CSharedMemoryWaitableObject *this,CPalThread *pthr)

{
  PAL_ERROR PVar1;
  CSimpleDataLock *pCVar2;
  SHMObjData *local_48;
  SHMObjData *psmod;
  VOID *pvSharedSynchData;
  SHMPTR shmObjData;
  
  pvSharedSynchData = (VOID *)0x0;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","EnsureObjectIsShared",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x4b3);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    (**(code **)(*g_pSynchronizationManager + 0x50))(g_pSynchronizationManager,pthr);
    PVar1 = 0;
    if ((this->super_CSharedMemoryObject).m_ObjectDomain != SharedObject) {
      SHMLock();
      if (((this->super_CSharedMemoryObject).super_CPalObjectBase.m_pot)->m_dwSharedDataSize == 0) {
        pCVar2 = (CSimpleDataLock *)0x0;
      }
      else {
        pCVar2 = &(this->super_CSharedMemoryObject).m_sdlSharedData;
        InternalEnterCriticalSection(pthr,&(this->super_CSharedMemoryObject).m_sdlSharedData.m_cs);
      }
      PVar1 = CSharedMemoryObject::AllocateSharedDataItems
                        (&this->super_CSharedMemoryObject,(SHMPTR *)&pvSharedSynchData,&local_48);
      if (PVar1 == 0) {
        PVar1 = (**(code **)(*g_pSynchronizationManager + 0x48))
                          (g_pSynchronizationManager,pthr,this->m_pvSynchData,&psmod);
        if (PVar1 == 0) {
          this->m_pvSynchData = psmod;
          local_48->pvSynchData = psmod;
          CSharedMemoryObject::PromoteSharedData
                    (&this->super_CSharedMemoryObject,(SHMPTR)pvSharedSynchData,local_48);
          (this->super_CSharedMemoryObject).m_ObjectDomain = SharedObject;
        }
      }
      if (pCVar2 != (CSimpleDataLock *)0x0) {
        (**(pCVar2->super_IDataLock)._vptr_IDataLock)(pCVar2,pthr,1);
      }
      SHMRelease();
    }
    (**(code **)(*g_pSynchronizationManager + 0x58))(g_pSynchronizationManager,pthr);
    if (pvSharedSynchData != (VOID *)0x0 && PVar1 != 0) {
      CSharedMemoryObject::FreeSharedDataAreas((SHMPTR)pvSharedSynchData);
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return PVar1;
    }
  }
  abort();
}

Assistant:

PAL_ERROR
CSharedMemoryWaitableObject::EnsureObjectIsShared(
    CPalThread *pthr
    )
{
    PAL_ERROR palError = NO_ERROR;
    IDataLock *pDataLock = NULL;
    SHMPTR shmObjData = SHMNULL;
    SHMObjData *psmod;
    VOID *pvSharedSynchData;

    _ASSERTE(NULL != pthr);

    ENTRY("CSharedMemoryWaitableObject::EnsureObjectIsShared"
        "(this = %p, pthr = %p)\n",
        this,
        pthr
        );
    
    //
    // First, grab the process synchronization lock and check
    // if the object is already shared
    //

    g_pSynchronizationManager->AcquireProcessLock(pthr);

    if (SharedObject == m_ObjectDomain)
    {
        goto EnsureObjectIsSharedExitNoSHMLockRelease;
    }

    //
    // Grab the necessary locks
    //

    SHMLock();

    if (0 != m_pot->GetSharedDataSize())
    {
        m_sdlSharedData.AcquireLock(pthr, &pDataLock);
    }

    //
    // Allocate the necessary shared data areas
    //

    palError = AllocateSharedDataItems(&shmObjData, &psmod);
    if (NO_ERROR != palError)
    {
        goto EnsureObjectIsSharedExit;
    }

    //
    // Promote the object's synchronization data
    //

    palError = g_pSynchronizationManager->PromoteObjectSynchData(
        pthr,
        m_pvSynchData,
        &pvSharedSynchData
        );

    if (NO_ERROR != palError)
    {
        goto EnsureObjectIsSharedExit;
    }

    m_pvSynchData = pvSharedSynchData;
    psmod->pvSynchData = pvSharedSynchData;

    //
    // Promote the object's data and set the domain to shared
    //

    PromoteSharedData(shmObjData, psmod);
    m_ObjectDomain = SharedObject;

EnsureObjectIsSharedExit:

    if (NULL != pDataLock)
    {
        pDataLock->ReleaseLock(pthr, TRUE);
    }

    SHMRelease();

EnsureObjectIsSharedExitNoSHMLockRelease:

    g_pSynchronizationManager->ReleaseProcessLock(pthr);

    if (NO_ERROR != palError && SHMNULL != shmObjData)
    {
        //
        // Since shmObjdData is local to this function there's no
        // need to continue to hold the promotion locks when
        // freeing the allocated data on error
        //
        
        FreeSharedDataAreas(shmObjData);
    }

    LOGEXIT("CSharedMemoryWaitableObject::EnsureObjectIsShared returns %d\n",
        palError
        );

    return palError;
}